

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *window)

{
  long in_RDI;
  ImRect IVar1;
  ImRect r_avoid_2;
  ImRect r_outer_2;
  ImVec2 ref_pos;
  float sc;
  ImRect r_avoid_1;
  ImRect r_outer_1;
  ImRect r_avoid;
  ImRect r_outer;
  float horizontal_overlap;
  ImGuiWindow *parent_window;
  ImGuiContext *g;
  ImVec2 pos;
  ImVec2 *in_stack_fffffffffffffef8;
  ImRect *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  float fVar2;
  undefined4 in_stack_ffffffffffffff14;
  float fVar3;
  ImVec2 local_e0 [4];
  ImGuiWindow *in_stack_ffffffffffffff40;
  undefined1 local_84 [16];
  ImRect local_74;
  undefined8 local_64;
  undefined8 local_5c;
  undefined8 local_54;
  undefined8 local_4c;
  undefined8 local_44;
  ImGuiPopupPositionPolicy in_stack_ffffffffffffffc4;
  ImGuiPopupPositionPolicy policy;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffcc;
  float fVar5;
  ImRect *in_stack_ffffffffffffffd0;
  ImRect *r_outer_00;
  undefined4 in_stack_ffffffffffffffd8;
  float fVar6;
  undefined4 in_stack_ffffffffffffffdc;
  float fVar7;
  ImVec2 *in_stack_ffffffffffffffe0;
  ImVec2 *size;
  ImGuiContext *pIVar8;
  ImVec2 local_8;
  
  if ((*(uint *)(in_RDI + 0xc) & 0x10000000) == 0) {
    if ((*(uint *)(in_RDI + 0xc) & 0x4000000) == 0) {
      if ((*(uint *)(in_RDI + 0xc) & 0x2000000) == 0) {
        local_8 = *(ImVec2 *)(in_RDI + 0x40);
      }
      else {
        pIVar8 = GImGui;
        NavCalcPreferredRefPos();
        GetWindowAllowedExtentRect(in_stack_ffffffffffffff40);
        ImRect::ImRect(in_stack_ffffffffffffff00);
        fVar7 = (float)((ulong)in_stack_ffffffffffffff00 >> 0x20);
        fVar5 = (float)((ulong)in_stack_ffffffffffffff08 >> 0x20);
        if ((((pIVar8->NavDisableHighlight & 1U) == 0) && ((pIVar8->NavDisableMouseHover & 1U) != 0)
            ) && (((pIVar8->IO).ConfigFlags & 4U) == 0)) {
          ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                         fVar5,(float)in_stack_ffffffffffffff08,fVar7,
                         SUB84(in_stack_ffffffffffffff00,0));
        }
        else {
          ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                         fVar5,(float)in_stack_ffffffffffffff08,fVar7,
                         SUB84(in_stack_ffffffffffffff00,0));
        }
        local_8 = FindBestWindowPosForPopupEx
                            ((ImVec2 *)pIVar8,in_stack_ffffffffffffffe0,
                             (ImGuiDir *)
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                             in_stack_ffffffffffffffd0,
                             (ImRect *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                             ,in_stack_ffffffffffffffc4);
        if (*(int *)(in_RDI + 200) == -1) {
          ImVec2::ImVec2(local_e0,2.0,2.0);
          local_8 = ::operator+(in_stack_fffffffffffffef8,(ImVec2 *)0x1b94fc);
        }
      }
    }
    else {
      pIVar8 = GImGui;
      local_74 = GetWindowAllowedExtentRect(in_stack_ffffffffffffff40);
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (float)((ulong)local_84 >> 0x20),SUB84(local_84,0),
                     (float)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                     SUB84(in_stack_ffffffffffffff00,0));
      local_8 = FindBestWindowPosForPopupEx
                          ((ImVec2 *)pIVar8,in_stack_ffffffffffffffe0,
                           (ImGuiDir *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                           ,in_stack_ffffffffffffffd0,
                           (ImRect *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                           in_stack_ffffffffffffffc4);
    }
  }
  else {
    size = *(ImVec2 **)(in_RDI + 0x3a8);
    fVar7 = (GImGui->Style).ItemInnerSpacing.x;
    pIVar8 = GImGui;
    IVar1 = GetWindowAllowedExtentRect(in_stack_ffffffffffffff40);
    fVar5 = IVar1.Min.x;
    r_outer_00 = IVar1._4_8_;
    fVar6 = IVar1.Max.y;
    ImRect::ImRect(in_stack_ffffffffffffff00);
    if (((uint)size[0x30].x & 0x10000) == 0) {
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (float)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                     (float)in_stack_ffffffffffffff08,
                     (float)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                     SUB84(in_stack_ffffffffffffff00,0));
      local_44 = local_64;
      policy = (ImGuiPopupPositionPolicy)local_5c;
      uVar4 = (undefined4)((ulong)local_5c >> 0x20);
    }
    else {
      fVar2 = size[8].y;
      ImGuiWindow::TitleBarHeight((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffff14,fVar2));
      fVar3 = size[8].y;
      ImGuiWindow::TitleBarHeight((ImGuiWindow *)CONCAT44(fVar3,fVar2));
      ImGuiWindow::MenuBarHeight((ImGuiWindow *)CONCAT44(fVar3,fVar2));
      ImRect::ImRect((ImRect *)CONCAT44(fVar3,fVar2),
                     (float)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                     (float)in_stack_ffffffffffffff08,
                     (float)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                     SUB84(in_stack_ffffffffffffff00,0));
      local_44 = local_54;
      policy = (ImGuiPopupPositionPolicy)local_4c;
      uVar4 = (undefined4)((ulong)local_4c >> 0x20);
    }
    local_8 = FindBestWindowPosForPopupEx
                        ((ImVec2 *)pIVar8,size,(ImGuiDir *)CONCAT44(fVar7,fVar6),r_outer_00,
                         (ImRect *)CONCAT44(fVar5,uVar4),policy);
  }
  return local_8;
}

Assistant:

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (window->Flags & ImGuiWindowFlags_ChildMenu)
    {
        // Child menus typically request _any_ position within the parent menu item, and then we move the new menu outside the parent bounds.
        // This is how we end up with child menus appearing (most-commonly) on the right of the parent menu.
        ImGuiWindow* parent_window = window->ParentWindow;
        float horizontal_overlap = g.Style.ItemInnerSpacing.x; // We want some overlap to convey the relative depth of each menu (currently the amount of overlap is hard-coded to style.ItemSpacing.x).
        ImRect r_outer = GetWindowAllowedExtentRect(window);
        ImRect r_avoid;
        if (parent_window->DC.MenuBarAppending)
            r_avoid = ImRect(-FLT_MAX, parent_window->Pos.y + parent_window->TitleBarHeight(), FLT_MAX, parent_window->Pos.y + parent_window->TitleBarHeight() + parent_window->MenuBarHeight());
        else
            r_avoid = ImRect(parent_window->Pos.x + horizontal_overlap, -FLT_MAX, parent_window->Pos.x + parent_window->Size.x - horizontal_overlap - parent_window->ScrollbarSizes.x, FLT_MAX);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid);
    }
    if (window->Flags & ImGuiWindowFlags_Popup)
    {
        ImRect r_outer = GetWindowAllowedExtentRect(window);
        ImRect r_avoid = ImRect(window->Pos.x - 1, window->Pos.y - 1, window->Pos.x + 1, window->Pos.y + 1);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid);
    }
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Position tooltip (always follows mouse)
        float sc = g.Style.MouseCursorScale;
        ImVec2 ref_pos = NavCalcPreferredRefPos();
        ImRect r_outer = GetWindowAllowedExtentRect(window);
        ImRect r_avoid;
        if (!g.NavDisableHighlight && g.NavDisableMouseHover && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableSetMousePos))
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 16, ref_pos.y + 8);
        else
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 24 * sc, ref_pos.y + 24 * sc); // FIXME: Hard-coded based on mouse cursor shape expectation. Exact dimension not very important.
        ImVec2 pos = FindBestWindowPosForPopupEx(ref_pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid);
        if (window->AutoPosLastDirection == ImGuiDir_None)
            pos = ref_pos + ImVec2(2, 2); // If there's not enough room, for tooltip we prefer avoiding the cursor at all cost even if it means that part of the tooltip won't be visible.
        return pos;
    }
    IM_ASSERT(0);
    return window->Pos;
}